

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O2

void __thiscall DGlow2::Tick(DGlow2 *this)

{
  int iVar1;
  int iVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  
  iVar4 = this->m_MaxTics;
  iVar2 = this->m_Tics;
  iVar5 = iVar2 + 1;
  this->m_Tics = iVar5;
  if (iVar2 < iVar4) {
    iVar2 = this->m_Start;
    iVar1 = this->m_End;
  }
  else {
    iVar2 = this->m_End;
    if (this->m_OneShot == true) {
      iVar5 = 0x7fff;
      if (iVar2 < 0x7fff) {
        iVar5 = iVar2;
      }
      iVar4 = -0x8000;
      if (-0x8000 < iVar5) {
        iVar4 = iVar5;
      }
      ((this->super_DLighting).super_DSectorEffect.m_Sector)->lightlevel = (short)iVar4;
      (*(this->super_DLighting).super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject[4])()
      ;
      return;
    }
    iVar1 = this->m_Start;
    this->m_Start = iVar2;
    this->m_End = iVar1;
    iVar5 = iVar5 - iVar4;
    this->m_Tics = iVar5;
  }
  iVar2 = ((iVar1 - iVar2) * iVar5) / iVar4 + iVar2;
  if (0x7ffe < iVar2) {
    iVar2 = 0x7fff;
  }
  sVar3 = -0x8000;
  if (-0x8000 < iVar2) {
    sVar3 = (short)iVar2;
  }
  ((this->super_DLighting).super_DSectorEffect.m_Sector)->lightlevel = sVar3;
  return;
}

Assistant:

void DGlow2::Tick ()
{
	if (m_Tics++ >= m_MaxTics)
	{
		if (m_OneShot)
		{
			m_Sector->SetLightLevel(m_End);
			Destroy ();
			return;
		}
		else
		{
			int temp = m_Start;
			m_Start = m_End;
			m_End = temp;
			m_Tics -= m_MaxTics;
		}
	}

	m_Sector->SetLightLevel(((m_End - m_Start) * m_Tics) / m_MaxTics + m_Start);
}